

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer_tests.cc
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
lf::io::test::
MeshFunctionLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/test/vtk_writer_tests.cc:218:37)>
::operator()(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
            MeshFunctionLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_io_test_vtk_writer_tests_cc:218:37)>
            *this,Entity *e,MatrixXd *x)

{
  uint uVar1;
  size_type __n;
  long lVar2;
  Index IVar3;
  reference pvVar4;
  ConstColXpr local_90;
  int local_58;
  int i;
  allocator<unsigned_int> local_41;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  MatrixXd *x_local;
  Entity *e_local;
  MeshFunctionLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_io_test_vtk_writer_tests_cc:218:37)>
  *this_local;
  
  result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)x;
  __n = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                  (&x->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  std::allocator<unsigned_int>::allocator(&local_41);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,__n,&local_41);
  std::allocator<unsigned_int>::~allocator(&local_41);
  local_58 = 0;
  while( true ) {
    lVar2 = (long)local_58;
    IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (IVar3 <= lVar2) break;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_90,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,(long)local_58);
    uVar1 = test::lf_io_VtkWriter_twoElementMeshCodim0AllData_Test::TestBody()::$_6::operator()
                      (this,e,&local_90);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                        (long)local_58);
    *pvVar4 = uVar1;
    local_58 = local_58 + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

auto operator()(const mesh::Entity& e, const Eigen::MatrixXd& x) const {
    std::vector<std::invoke_result_t<F, const mesh::Entity&, Eigen::Matrix2d>>
        result(x.cols());
    for (int i = 0; i < x.cols(); ++i) {
      result[i] = f_(e, x.col(i));
    }
    return result;
  }